

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O1

void poll_cb(uv_poll_t *handle,int status,int events)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char buffer [5];
  int fd;
  int local_2c;
  char local_28;
  int local_24;
  
  iVar1 = uv_fileno(handle,&stack0xffffffffffffffdc);
  if (iVar1 == 0) {
    local_28 = '\0';
    local_2c = 0;
    if ((events & 8U) != 0) {
      do {
        handle = (uv_poll_t *)(ulong)(uint)client_fd;
        sVar3 = recv(client_fd,&stack0xffffffffffffffd4,5,1);
        if ((int)sVar3 != -1) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      if ((-1 < (int)sVar3) || (piVar4 = __errno_location(), *piVar4 != 0x16)) {
        cli_pr_check = 1;
        handle = poll_req;
        iVar1 = uv_poll_stop(poll_req);
        if (iVar1 != 0) goto LAB_00173933;
        handle = poll_req;
        iVar1 = uv_poll_start(poll_req,3,poll_cb);
        if (iVar1 == 0) goto LAB_00173732;
        goto LAB_00173938;
      }
      goto LAB_0017394c;
    }
LAB_00173732:
    if ((events & 1U) == 0) goto LAB_001738e5;
    if (local_24 != client_fd) goto LAB_00173866;
    do {
      handle = (uv_poll_t *)(ulong)(uint)client_fd;
      sVar3 = recv(client_fd,&stack0xffffffffffffffd4,5,0);
      iVar1 = (int)sVar3;
      if (iVar1 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((iVar1 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) goto LAB_0017395b;
    if (cli_rd_check == 1) {
      handle = (uv_poll_t *)&stack0xffffffffffffffd4;
      iVar2 = strncmp((char *)handle,"world",(long)iVar1);
      if (iVar2 != 0) goto LAB_00173951;
      if (iVar1 == 5) {
        cli_rd_check = 2;
        goto LAB_001737c4;
      }
      goto LAB_00173956;
    }
LAB_001737c4:
    if (cli_rd_check == 0) {
      if (iVar1 != 4) goto LAB_00173960;
      if (local_2c == 0x6c6c6568) {
        iVar1 = 1;
LAB_001737fe:
        do {
          cli_rd_check = iVar1;
          handle = (uv_poll_t *)(ulong)(uint)server_fd;
          sVar3 = recv(server_fd,&stack0xffffffffffffffd4,5,0);
          iVar2 = (int)sVar3;
          if (iVar2 == -1) {
            piVar4 = __errno_location();
            iVar1 = cli_rd_check;
            if (*piVar4 == 4) goto LAB_001737fe;
          }
          if (iVar2 < 1) goto LAB_00173851;
          if (iVar2 != 5) {
            poll_cb_cold_14();
            goto LAB_0017392e;
          }
          iVar1 = 2;
        } while (local_28 == 'd' && local_2c == 0x6c726f77);
        poll_cb_cold_15();
LAB_00173851:
        piVar4 = __errno_location();
        if ((*piVar4 != 0xb) && (*piVar4 != 0x73)) goto LAB_0017396f;
        goto LAB_00173866;
      }
      goto LAB_00173965;
    }
LAB_00173866:
    if (local_24 != server_fd) {
LAB_001738e5:
      if ((events & 2U) == 0) {
        return;
      }
      do {
        handle = (uv_poll_t *)(ulong)(uint)client_fd;
        sVar3 = send(client_fd,"foo",3,0);
        if (-1 < (int)sVar3) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      if ((int)sVar3 == 3) {
        return;
      }
      goto LAB_0017393d;
    }
    do {
      handle = (uv_poll_t *)(ulong)(uint)server_fd;
      sVar3 = recv(server_fd,&stack0xffffffffffffffd4,3,0);
      iVar1 = (int)sVar3;
      if (iVar1 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if ((-1 < iVar1) || (piVar4 = __errno_location(), *piVar4 != 0x16)) {
      if (iVar1 != 3) goto LAB_00173942;
      if (local_2c._2_1_ == 'o' && (short)local_2c == 0x6f66) {
        srv_rd_check = 1;
        uv_poll_stop(0x327510);
        goto LAB_001738e5;
      }
      goto LAB_00173947;
    }
  }
  else {
LAB_0017392e:
    poll_cb_cold_1();
LAB_00173933:
    poll_cb_cold_3();
LAB_00173938:
    poll_cb_cold_4();
LAB_0017393d:
    poll_cb_cold_16();
LAB_00173942:
    poll_cb_cold_11();
LAB_00173947:
    poll_cb_cold_12();
LAB_0017394c:
    poll_cb_cold_2();
LAB_00173951:
    poll_cb_cold_6();
LAB_00173956:
    poll_cb_cold_7();
LAB_0017395b:
    poll_cb_cold_5();
LAB_00173960:
    poll_cb_cold_8();
LAB_00173965:
    poll_cb_cold_9();
  }
  poll_cb_cold_10();
LAB_0017396f:
  poll_cb_cold_13();
  uv_sleep(100);
  iVar1 = ticks;
  ticks = ticks + 1;
  if (iVar1 < 9) {
    return;
  }
  uv_poll_stop(poll_req);
  uv_poll_stop(0x327510);
  uv_close(&server_handle,0);
  uv_close(&client_handle,0);
  uv_close(&peer_handle,0);
  uv_close(handle,0);
  return;
}

Assistant:

static void poll_cb(uv_fs_poll_t* handle,
                    int status,
                    const uv_stat_t* prev,
                    const uv_stat_t* curr) {
  uv_stat_t zero_statbuf;

  memset(&zero_statbuf, 0, sizeof(zero_statbuf));

  ASSERT(handle == &poll_handle);
  ASSERT(1 == uv_is_active((uv_handle_t*) handle));
  ASSERT_NOT_NULL(prev);
  ASSERT_NOT_NULL(curr);

  switch (poll_cb_called++) {
  case 0:
    ASSERT(status == UV_ENOENT);
    ASSERT(0 == memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    touch_file(FIXTURE);
    break;

  case 1:
    ASSERT(status == 0);
    ASSERT(0 == memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 20, 0));
    break;

  case 2:
    ASSERT(status == 0);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 200, 0));
    break;

  case 3:
    ASSERT(status == 0);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    remove(FIXTURE);
    break;

  case 4:
    ASSERT(status == UV_ENOENT);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    uv_close((uv_handle_t*)handle, close_cb);
    break;

  default:
    ASSERT(0);
  }
}